

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void y_object_suite::y_object_string_unicode(void)

{
  undefined4 local_268;
  value local_264 [2];
  undefined4 local_25c;
  value local_258 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined4 local_22c;
  value local_228 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined4 local_1f8;
  value local_1f4 [6];
  undefined4 local_1dc;
  value local_1d8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  undefined1 local_1c0 [8];
  reader reader;
  char input [111];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x22656c746974227b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1d0,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_1c0,&local_1d0);
  local_1d8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_1c0);
  local_1dc = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd34,"void y_object_suite::y_object_string_unicode()",local_1d8,&local_1dc);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_1c0);
  local_1f4[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_1c0);
  local_1f8 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd36,"void y_object_suite::y_object_string_unicode()",local_1f4,&local_1f8);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
            (&local_220,(basic_reader<char> *)local_1c0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("reader.value<std::string>()","\"title\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd37,"void y_object_suite::y_object_string_unicode()",&local_220,"title");
  std::__cxx11::string::~string((string *)&local_220);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_1c0);
  local_228[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_1c0);
  local_22c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd39,"void y_object_suite::y_object_string_unicode()",local_228,&local_22c);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
            (&local_250,(basic_reader<char> *)local_1c0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[34]>
            ("reader.value<std::string>()",
             "\"\\u041f\\u043e\\u043b\\u0442\\u043e\\u0440\\u0430 \\u0417\\u0435\\u043c\\u043b\\u0435\\u043a\\u043e\\u043f\\u0430\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3a,"void y_object_suite::y_object_string_unicode()",&local_250,anon_var_dwarf_599d)
  ;
  std::__cxx11::string::~string((string *)&local_250);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_1c0);
  local_258[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_1c0);
  local_25c = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3c,"void y_object_suite::y_object_string_unicode()",local_258,&local_25c);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_1c0);
  local_264[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_1c0);
  local_268 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3e,"void y_object_suite::y_object_string_unicode()",local_264,&local_268);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_1c0);
  return;
}

Assistant:

void y_object_string_unicode()
{
    const char input[] = "{\"title\":\"\\u041f\\u043e\\u043b\\u0442\\u043e\\u0440\\u0430 \\u0417\\u0435\\u043c\\u043b\\u0435\\u043a\\u043e\\u043f\\u0430\" }";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "title");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\u041f\u043e\u043b\u0442\u043e\u0440\u0430 \u0417\u0435\u043c\u043b\u0435\u043a\u043e\u043f\u0430");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}